

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

LPCWSTR __thiscall
Js::DeferDeserializeFunctionInfo::GetSourceInfo
          (DeferDeserializeFunctionInfo *this,int *lineNumber,int *columnNumber)

{
  SourceContextInfo *pSVar1;
  ULONG UVar2;
  char16 *pcVar3;
  ULONG local_3c;
  ULONG local_38;
  int lineNumberField;
  int columnNumberField;
  bool m_isEval;
  bool m_isDynamicFunction;
  
  ByteCodeSerializer::ReadSourceInfo
            (this,(int *)&local_3c,(int *)&local_38,(bool *)((long)&lineNumberField + 2),
             (bool *)((long)&lineNumberField + 3));
  UVar2 = FunctionProxy::ComputeAbsoluteLineNumber(&this->super_FunctionProxy,local_3c);
  *lineNumber = UVar2;
  UVar2 = FunctionProxy::ComputeAbsoluteColumnNumber(&this->super_FunctionProxy,local_3c,local_38);
  *columnNumber = UVar2;
  pSVar1 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo
           ).ptr;
  if ((pSVar1->dwHostSourceContext == 0xffffffffffffffff) ||
     ((pSVar1->isHostDynamicDocument & 1U) != 0)) {
    if (lineNumberField._3_1_ == '\0') {
      pcVar3 = L"Unknown script code";
    }
    else {
      pcVar3 = L"Function code";
    }
    if (lineNumberField._2_1_ != '\0') {
      pcVar3 = L"eval code";
    }
  }
  else {
    pcVar3 = (pSVar1->field_5).field_0.url;
  }
  return pcVar3;
}

Assistant:

LPCWSTR DeferDeserializeFunctionInfo::GetSourceInfo(int& lineNumber, int& columnNumber) const
    {
        // Read all the necessary information from the serialized byte code
        int lineNumberField, columnNumberField;
        bool m_isEval, m_isDynamicFunction;
        ByteCodeSerializer::ReadSourceInfo(this, lineNumberField, columnNumberField, m_isEval, m_isDynamicFunction);

        // Decode them
        lineNumber = ComputeAbsoluteLineNumber(lineNumberField);
        columnNumber = ComputeAbsoluteColumnNumber(lineNumberField, columnNumberField);
        return Js::ParseableFunctionInfo::GetSourceName<SourceContextInfo*>(this->GetSourceContextInfo(), m_isEval, m_isDynamicFunction);
    }